

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

FastPattern *
trieste::detail::FastPattern::match_choice
          (FastPattern *__return_storage_ptr__,FastPattern *lhs,FastPattern *rhs)

{
  byte bVar1;
  byte bVar2;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> new_parent;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> new_first;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_88;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_58;
  
  bVar1 = 1;
  if (lhs->pass_through == false) {
    bVar1 = rhs->pass_through;
  }
  new_first._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_first._M_t._M_impl.super__Rb_tree_header._M_header;
  new_first._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_first._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  new_first._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_first._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = 0;
  if ((rhs->pass_through & 1U) != 0 ||
      (rhs->starts)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if ((lhs->starts)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
        (lhs->pass_through & 1U) == 0) {
      bVar2 = 0;
    }
    else {
      std::
      _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
      ::operator=((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                   *)&new_first,
                  (_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                   *)lhs);
      std::
      _Rb_tree<trieste::Token,trieste::Token,std::_Identity<trieste::Token>,std::less<trieste::Token>,std::allocator<trieste::Token>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<trieste::Token>>
                ((_Rb_tree<trieste::Token,trieste::Token,std::_Identity<trieste::Token>,std::less<trieste::Token>,std::allocator<trieste::Token>>
                  *)&new_first,(rhs->starts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<trieste::Token>)
                 &(rhs->starts)._M_t._M_impl.super__Rb_tree_header);
      bVar2 = bVar1;
    }
  }
  new_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_parent._M_t._M_impl.super__Rb_tree_header._M_header;
  new_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_parent._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  new_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((rhs->parents)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     ((lhs->parents)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::
    _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
    ::operator=((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                 *)&new_parent,&(lhs->parents)._M_t);
    std::
    _Rb_tree<trieste::Token,trieste::Token,std::_Identity<trieste::Token>,std::less<trieste::Token>,std::allocator<trieste::Token>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<trieste::Token>>
              ((_Rb_tree<trieste::Token,trieste::Token,std::_Identity<trieste::Token>,std::less<trieste::Token>,std::allocator<trieste::Token>>
                *)&new_parent,(rhs->parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<trieste::Token>)
               &(rhs->parents)._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
              *)&local_58,&new_first._M_t);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
              *)&local_88,&new_parent._M_t);
  FastPattern(__return_storage_ptr__,&local_58,&local_88,(bool)(bVar2 & 1));
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_88);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_58);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&new_parent);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&new_first);
  return __return_storage_ptr__;
}

Assistant:

static FastPattern
      match_choice(const FastPattern& lhs, const FastPattern& rhs)
      {
        bool new_pass_through = lhs.pass_through || rhs.pass_through;
        std::set<Token> new_first;
        // any_first is annihilator for choice, so special cases required.
        // otherwise, we treat it as union
        if (!rhs.any_first() && !lhs.any_first())
        {
          new_first = lhs.starts;
          new_first.insert(rhs.starts.begin(), rhs.starts.end());
        }
        else
        {
          // Any first is true of one disjunct, so set pass_through to
          // false, and first to empty, to continue the any_first property.
          new_pass_through = false;
        }

        std::set<Token> new_parent;
        // Empty is treat as universal parent, so maintain universal
        // otherwise, we treat it as union
        if (!rhs.parents.empty() && !lhs.parents.empty())
        {
          new_parent = lhs.parents;
          new_parent.insert(rhs.parents.begin(), rhs.parents.end());
        }

        return FastPattern(new_first, new_parent, new_pass_through);
      }